

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroIO.hpp
# Opt level: O0

void __thiscall OpenMD::HydroIO::HydroIO(HydroIO *this)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_RDI;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *unaff_retaddr;
  CrtAllocator *in_stack_ffffffffffffffe8;
  size_t in_stack_fffffffffffffff0;
  
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::PrettyWriter((PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                  *)0x0,(CrtAllocator *)in_RDI,(size_t)&in_RDI->shared_);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(unaff_retaddr,in_RDI,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

HydroIO() {}